

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<ProString>::copyAppend
          (QGenericArrayOps<ProString> *this,ProString *b,ProString *e)

{
  ProString *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ProString *in_RDI;
  ProString *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<ProString>::begin((QArrayDataPointer<ProString> *)0x1461c7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      ProString::ProString(this_00,in_RDI);
      local_10 = local_10 + 0x30;
      (in_RDI->m_string).d.size = (in_RDI->m_string).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }